

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeComputeTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::exceed_texture_image_units_limit
               (NegativeTestContext *ctx)

{
  ostringstream *poVar1;
  RenderContext *renderCtx;
  pointer log;
  int iVar2;
  ostream *poVar3;
  ProgramSources *sources;
  int iVar4;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  undefined1 local_598 [40];
  undefined1 local_570 [184];
  undefined1 uStack_4b8;
  undefined7 uStack_4b7;
  undefined1 uStack_4b0;
  undefined8 uStack_4af;
  ShaderProgram program;
  ostringstream shaderBody;
  ostringstream shaderDecl;
  
  iVar2 = getResourceLimit(ctx,0x91bc);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderDecl);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderBody);
  poVar3 = std::operator<<((ostream *)&shaderDecl,"layout(binding = 0) ");
  poVar3 = std::operator<<(poVar3,"uniform highp sampler2D u_sampler[");
  iVar2 = iVar2 + 2;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  poVar3 = std::operator<<(poVar3,"];\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"layout(binding = 0) buffer Output {\n");
  poVar3 = std::operator<<(poVar3,"    vec4 values[ ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  poVar3 = std::operator<<(poVar3," ];\n");
  std::operator<<(poVar3,"} sb_out;\n");
  iVar4 = 0;
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  for (; iVar2 != iVar4; iVar4 = iVar4 + 1) {
    poVar3 = std::operator<<((ostream *)&shaderBody,"   sb_out.values[");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar4);
    poVar3 = std::operator<<(poVar3,"] = texture(u_sampler[");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar4);
    std::operator<<(poVar3,"], vec2(1.0f));\n");
  }
  renderCtx = ctx->m_renderCtx;
  memset(local_570,0,0xac);
  local_570._176_8_ = (pointer)0x0;
  uStack_4b8 = 0;
  uStack_4b7 = 0;
  uStack_4b0 = 0;
  uStack_4af = 0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  generateComputeShader(&local_5b8,ctx,&local_5d8,&local_5f8);
  glu::ComputeSource::ComputeSource((ComputeSource *)local_598,&local_5b8);
  sources = glu::ProgramSources::operator<<((ProgramSources *)local_570,(ShaderSource *)local_598);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,sources);
  std::__cxx11::string::~string((string *)(local_598 + 8));
  std::__cxx11::string::~string((string *)&local_5b8);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::__cxx11::string::~string((string *)&local_5d8);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_570);
  log = (pointer)(ctx->super_CallLogWrapper).m_log;
  poVar1 = (ostringstream *)(local_570 + 8);
  local_570._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,
                  "Possible link error is generated if compute shader exceeds GL_MAX_COMPUTE_TEXTURE_IMAGE_UNITS."
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_570,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  glu::operator<<((TestLog *)log,&program);
  if (program.m_program.m_info.linkOk == true) {
    poVar1 = (ostringstream *)(local_570 + 8);
    local_570._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Quality Warning: program was not expected to link.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_570,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,program.m_program.m_program);
    NegativeTestContext::expectError(ctx,0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_570,
               "GL_INVALID_OPERATION error is generated if the sum of the number of active samplers for each active program exceeds the maximum number of texture image units allowed"
               ,(allocator<char> *)local_598);
    NegativeTestContext::beginSection(ctx,(string *)local_570);
    std::__cxx11::string::~string((string *)local_570);
    glu::CallLogWrapper::glDispatchCompute(&ctx->super_CallLogWrapper,1,1,1);
    NegativeTestContext::expectError(ctx,0x501);
    NegativeTestContext::endSection(ctx);
  }
  glu::ShaderProgram::~ShaderProgram(&program);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaderBody);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaderDecl);
  return;
}

Assistant:

void exceed_texture_image_units_limit (NegativeTestContext& ctx)
{
	const int			limit			= getResourceLimit(ctx, GL_MAX_COMPUTE_TEXTURE_IMAGE_UNITS) + 1;
	std::ostringstream	shaderDecl;
	std::ostringstream	shaderBody;

	shaderDecl	<< "layout(binding = 0) "
				<< "uniform highp sampler2D u_sampler[" << limit + 1 << "];\n"
				<< "\n"
				<< "layout(binding = 0) buffer Output {\n"
				<< "    vec4 values[ " << limit + 1 << " ];\n"
				<< "} sb_out;\n";

	for (int i = 0; i < limit + 1; ++i)
		shaderBody	<< "   sb_out.values[" << i << "] = texture(u_sampler[" << i << "], vec2(1.0f));\n";

	glu::ShaderProgram	program(ctx.getRenderContext(), glu::ProgramSources()
			<< glu::ComputeSource(generateComputeShader(ctx, shaderDecl.str(), shaderBody.str())));

	tcu::TestLog& log = ctx.getLog();
	log << tcu::TestLog::Message << "Possible link error is generated if compute shader exceeds GL_MAX_COMPUTE_TEXTURE_IMAGE_UNITS." << tcu::TestLog::EndMessage;
	log << program;

	if (program.getProgramInfo().linkOk)
	{
		log << tcu::TestLog::Message << "Quality Warning: program was not expected to link." << tcu::TestLog::EndMessage;
		ctx.glUseProgram(program.getProgram());
		ctx.expectError(GL_NO_ERROR);

		ctx.beginSection("GL_INVALID_OPERATION error is generated if the sum of the number of active samplers for each active program exceeds the maximum number of texture image units allowed");
		ctx.glDispatchCompute(1, 1, 1);
		ctx.expectError(GL_INVALID_VALUE);
		ctx.endSection();
	}
}